

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteBlif.c
# Opt level: O2

void Bac_ManWriteBlifLines(FILE *pFile,Bac_Ntk_t *p)

{
  Abc_Nam_t *p_00;
  int iVar1;
  Bac_ObjType_t BVar2;
  int iVar3;
  int iVar4;
  Bac_Ntk_t *p_01;
  char *pcVar5;
  Mio_Library_t *pLib;
  Mio_Gate_t *pGate;
  char *pcVar6;
  int i;
  int iVar7;
  int iVar8;
  int iVar9;
  
  iVar9 = 1;
  iVar7 = -1;
  i = 0;
  do {
    if ((p->vType).nSize <= i) {
      return;
    }
    iVar1 = Bac_ObjIsBox(p,i);
    if (iVar1 != 0) {
      BVar2 = Bac_ObjType(p,i);
      if (BVar2 == BAC_OBJ_BOX) {
        fwrite(".subckt",7,1,(FILE *)pFile);
        p_01 = Bac_BoxNtk(p,i);
        pcVar5 = Bac_NtkName(p_01);
        fprintf((FILE *)pFile," %s",pcVar5);
        Bac_ManWriteBlifArray2(pFile,p,i);
      }
      else {
        BVar2 = Bac_ObjType(p,i);
        if (BVar2 == BAC_BOX_GATE) {
          p_00 = p->pDesign->pMods;
          iVar1 = Bac_BoxNtkId(p,i);
          pcVar5 = Abc_NamStr(p_00,iVar1);
          iVar8 = 0;
          pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
          pGate = Mio_LibraryReadGateByName(pLib,pcVar5,(char *)0x0);
          fprintf((FILE *)pFile,".gate %s",pcVar5);
          iVar1 = iVar7;
          while ((iVar4 = iVar9, iVar1 != -1 && (iVar3 = Bac_ObjIsBi(p,iVar1), iVar3 != 0))) {
            pcVar5 = Mio_GateReadPinName(pGate,iVar8);
            pcVar6 = Bac_ObjNameStr(p,iVar1);
            fprintf((FILE *)pFile," %s=%s",pcVar5,pcVar6);
            iVar8 = iVar8 + 1;
            iVar1 = iVar1 + -1;
          }
          while ((iVar4 < (p->vType).nSize && (iVar1 = Bac_ObjIsBo(p,iVar4), iVar1 != 0))) {
            pcVar5 = Mio_GateReadOutName(pGate);
            pcVar6 = Bac_ObjNameStr(p,iVar4);
            fprintf((FILE *)pFile," %s=%s",pcVar5,pcVar6);
            iVar4 = iVar4 + 1;
          }
          fputc(10,(FILE *)pFile);
        }
        else {
          fwrite(".names",6,1,(FILE *)pFile);
          iVar1 = i;
          while (iVar8 = iVar9, 0 < iVar1) {
            iVar1 = iVar1 + -1;
            iVar4 = Bac_ObjIsBi(p,iVar1);
            if (iVar4 == 0) break;
            iVar8 = Bac_ObjFanin(p,iVar1);
            pcVar5 = Bac_ObjNameStr(p,iVar8);
            fprintf((FILE *)pFile," %s",pcVar5);
          }
          while ((iVar8 < (p->vType).nSize && (iVar1 = Bac_ObjIsBo(p,iVar8), iVar1 != 0))) {
            pcVar5 = Bac_ObjNameStr(p,iVar8);
            fprintf((FILE *)pFile," %s",pcVar5);
            iVar8 = iVar8 + 1;
          }
          BVar2 = Bac_ObjType(p,i);
          if (0xf < BVar2 - BAC_BOX_CF) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                          ,0x3c0,"char *Ptr_TypeToSop(Bac_ObjType_t)");
          }
          fprintf((FILE *)pFile,"\n%s",
                  &DAT_007a4430 + *(int *)(&DAT_007a4430 + (ulong)(BVar2 - BAC_BOX_CF) * 4));
        }
      }
    }
    i = i + 1;
    iVar9 = iVar9 + 1;
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

void Bac_ManWriteBlifLines( FILE * pFile, Bac_Ntk_t * p )
{
    int i, k, iTerm;
    Bac_NtkForEachBox( p, i )
    {
        if ( Bac_ObjIsBoxUser(p, i) )
        {
            fprintf( pFile, ".subckt" );
            fprintf( pFile, " %s", Bac_NtkName(Bac_BoxNtk(p, i)) );
            Bac_ManWriteBlifArray2( pFile, p, i );
        }
        else if ( Bac_ObjIsGate(p, i) )
        {
            char * pGateName = Abc_NamStr(p->pDesign->pMods, Bac_BoxNtkId(p, i));
            Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
            Mio_Gate_t * pGate = Mio_LibraryReadGateByName( pLib, pGateName, NULL );
            fprintf( pFile, ".gate %s", pGateName );
            Bac_BoxForEachBi( p, i, iTerm, k )
                fprintf( pFile, " %s=%s", Mio_GateReadPinName(pGate, k), Bac_ObjNameStr(p, iTerm) );
            Bac_BoxForEachBo( p, i, iTerm, k )
                fprintf( pFile, " %s=%s", Mio_GateReadOutName(pGate), Bac_ObjNameStr(p, iTerm) );
            fprintf( pFile, "\n" );
        }
        else
        {
            fprintf( pFile, ".names" );
            Bac_BoxForEachBi( p, i, iTerm, k )
                fprintf( pFile, " %s", Bac_ObjNameStr(p, Bac_ObjFanin(p, iTerm)) );
            Bac_BoxForEachBo( p, i, iTerm, k )
                fprintf( pFile, " %s", Bac_ObjNameStr(p, iTerm) );
            fprintf( pFile, "\n%s",  Ptr_TypeToSop(Bac_ObjType(p, i)) );
        }
    }
}